

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

nodeid_t __thiscall BasePort::ConvertBoardToNode(BasePort *this,uchar boardId)

{
  byte boardId_00;
  undefined2 local_14;
  nodeid_t node;
  uchar boardId_local;
  BasePort *this_local;
  
  local_14 = 0x40;
  boardId_00 = boardId & 0x3f;
  if (boardId_00 < 0x10) {
    local_14 = GetNodeId(this,boardId_00);
  }
  else if (boardId_00 == 0x3f) {
    local_14 = 0x3f;
  }
  return local_14;
}

Assistant:

nodeid_t BasePort::ConvertBoardToNode(unsigned char boardId) const
{
    nodeid_t node = MAX_NODES;                  // Invalid value
    boardId = boardId&FW_NODE_MASK;
    if (boardId < BoardIO::MAX_BOARDS)
        node = GetNodeId(boardId);
    else if (boardId == FW_NODE_BROADCAST)
        node = FW_NODE_BROADCAST;
    return node;
}